

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_tasking.cpp
# Opt level: O0

void __kmp_task_reduction_init_copy<kmp_task_red_input>
               (kmp_info_t *thr,int num,kmp_task_red_input *data,kmp_taskgroup_t *tg,
               void *reduce_data)

{
  void *__dest;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  void *in_R8;
  int i;
  kmp_taskred_data_t *arr;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar1;
  kmp_info_t *in_stack_ffffffffffffffd0;
  
  __dest = ___kmp_thread_malloc
                     (in_stack_ffffffffffffffd0,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  memcpy(__dest,in_R8,(long)in_ESI * 0x48);
  for (iVar1 = 0; iVar1 < in_ESI; iVar1 = iVar1 + 1) {
    *(undefined8 *)((long)__dest + (long)iVar1 * 0x48) =
         *(undefined8 *)(in_RDX + (long)iVar1 * 0x30);
  }
  *(void **)(in_RCX + 0x10) = __dest;
  *(int *)(in_RCX + 0x18) = in_ESI;
  return;
}

Assistant:

void __kmp_task_reduction_init_copy(kmp_info_t *thr, int num, T *data,
                                    kmp_taskgroup_t *tg, void *reduce_data) {
  kmp_taskred_data_t *arr;
  KA_TRACE(20, ("__kmp_task_reduction_init_copy: Th %p, init taskgroup %p,"
                " from data %p\n",
                thr, tg, reduce_data));
  arr = (kmp_taskred_data_t *)__kmp_thread_malloc(
      thr, num * sizeof(kmp_taskred_data_t));
  // threads will share private copies, thunk routines, sizes, flags, etc.:
  KMP_MEMCPY(arr, reduce_data, num * sizeof(kmp_taskred_data_t));
  for (int i = 0; i < num; ++i) {
    arr[i].reduce_shar = data[i].reduce_shar; // init unique shared pointers
  }
  tg->reduce_data = (void *)arr;
  tg->reduce_num_data = num;
}